

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daemons.cpp
# Opt level: O0

int rollwand(int arg)

{
  int iVar1;
  int type;
  int arg_local;
  
  between = between + 1;
  if (3 < between) {
    iVar1 = roll(1,6);
    if (iVar1 == 4) {
      wanderer();
      kill_daemon(rollwand);
      iVar1 = spread(0x46);
      type = spread(1);
      fuse(swander,0,iVar1,type);
    }
    between = 0;
  }
  return 0;
}

Assistant:

int rollwand(int arg)
{

    if (++between >= 4)
    {
        if (roll(1, 6) == 4)
        {
            wanderer();
            kill_daemon(rollwand);
            fuse(swander, 0, WANDERTIME, BEFORE);
        }
        between = 0;
    }
    return 0;
}